

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<float>::AdjustResidual(TPZDohrSubstruct<float> *this,TPZFMatrix<float> *r_global)

{
  float fVar1;
  int iVar2;
  int64_t iVar3;
  int *piVar4;
  float *pfVar5;
  pair<int,_int> *ppVar6;
  TPZMatrix<float> *pTVar7;
  ostream *poVar8;
  void *this_00;
  TPZFMatrix<float> *in_RSI;
  long in_RDI;
  double dVar9;
  pair<int,_int> ind_1;
  TPZFMatrix<float> radjust;
  TPZFMatrix<float> rloc;
  pair<int,_int> ind;
  int neqs;
  int i;
  TPZFMatrix<float> radapt;
  TPZFMatrix<float> rint;
  int nint;
  int nglob;
  int64_t in_stack_fffffffffffffc50;
  float *in_stack_fffffffffffffc58;
  TPZFMatrix<float> *in_stack_fffffffffffffc60;
  float *in_stack_fffffffffffffc88;
  int64_t in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  TPZFMatrix<float> *in_stack_fffffffffffffca0;
  undefined1 local_290 [148];
  undefined4 local_1fc;
  undefined1 local_1f8 [144];
  pair<int,_int> local_168;
  int local_15c;
  int local_158;
  undefined4 local_144;
  undefined1 local_140 [8];
  TPZFMatrix<float> *in_stack_fffffffffffffec8;
  TPZFMatrix<float> *in_stack_fffffffffffffed0;
  TPZFMatrix<float> *in_stack_fffffffffffffed8;
  TPZStepSolver<float> *in_stack_fffffffffffffee0;
  
  iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x8d0));
  iVar2 = (int)iVar3;
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffffca0,CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)
             ,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  local_144 = 0;
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffffca0,CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)
             ,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  for (local_158 = 0; local_158 < iVar2; local_158 = local_158 + 1) {
    piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x8d0),(long)local_158);
    piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x590),(long)*piVar4);
    if (-1 < *piVar4) {
      piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x8d0),(long)local_158);
      piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x590),(long)*piVar4);
      pfVar5 = TPZFMatrix<float>::operator()(in_RSI,(long)*piVar4);
      fVar1 = *pfVar5;
      pfVar5 = TPZFMatrix<float>::operator()
                         (in_stack_fffffffffffffc60,(int64_t)in_stack_fffffffffffffc58,
                          in_stack_fffffffffffffc50);
      *pfVar5 = fVar1;
    }
  }
  iVar3 = TPZVec<std::pair<int,_int>_>::NElements((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5b0));
  local_15c = (int)iVar3;
  for (local_158 = 0; local_158 < local_15c; local_158 = local_158 + 1) {
    ppVar6 = TPZVec<std::pair<int,_int>_>::operator[]
                       ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5b0),(long)local_158);
    local_168 = *ppVar6;
    pfVar5 = TPZFMatrix<float>::operator()
                       (in_stack_fffffffffffffc60,(int64_t)in_stack_fffffffffffffc58,
                        in_stack_fffffffffffffc50);
    fVar1 = *pfVar5;
    pfVar5 = TPZFMatrix<float>::operator()
                       (in_stack_fffffffffffffc60,(int64_t)in_stack_fffffffffffffc58,
                        in_stack_fffffffffffffc50);
    *pfVar5 = fVar1;
  }
  TPZStepSolver<float>::Solve
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  local_1fc = 0;
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffffca0,CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)
             ,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffffca0,CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)
             ,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  for (local_158 = 0; local_158 < iVar2; local_158 = local_158 + 1) {
    pfVar5 = TPZFMatrix<float>::operator()
                       (in_stack_fffffffffffffc60,(int64_t)in_stack_fffffffffffffc58,
                        in_stack_fffffffffffffc50);
    fVar1 = *pfVar5;
    TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x8d0),(long)local_158);
    pfVar5 = TPZFMatrix<float>::operator()
                       (in_stack_fffffffffffffc60,(int64_t)in_stack_fffffffffffffc58,
                        in_stack_fffffffffffffc50);
    *pfVar5 = fVar1;
  }
  pTVar7 = TPZAutoPointer<TPZMatrix<float>_>::operator->
                     ((TPZAutoPointer<TPZMatrix<float>_> *)(in_RDI + 0x4f8));
  (*(pTVar7->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])
            (0xbf800000,0x3f800000,pTVar7,local_1f8,local_140,local_290,0);
  for (local_158 = 0; local_158 < iVar2; local_158 = local_158 + 1) {
    TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x8d0),(long)local_158);
    pfVar5 = TPZFMatrix<float>::operator()
                       (in_stack_fffffffffffffc60,(int64_t)in_stack_fffffffffffffc58,
                        in_stack_fffffffffffffc50);
    dVar9 = std::fabs((double)(ulong)(uint)*pfVar5);
    if (1e-10 <= SUB84(dVar9,0)) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Internal node ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_158);
      poVar8 = std::operator<<(poVar8," was not zeroed ");
      TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x8d0),(long)local_158);
      pfVar5 = TPZFMatrix<float>::operator()
                         (in_stack_fffffffffffffc60,(int64_t)in_stack_fffffffffffffc58,
                          in_stack_fffffffffffffc50);
      this_00 = (void *)std::ostream::operator<<(poVar8,*pfVar5);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    in_stack_fffffffffffffc60 =
         (TPZFMatrix<float> *)
         TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x8d0),(long)local_158);
    in_stack_fffffffffffffc58 =
         TPZFMatrix<float>::operator()
                   (in_stack_fffffffffffffc60,(int64_t)in_stack_fffffffffffffc58,
                    in_stack_fffffffffffffc50);
    *in_stack_fffffffffffffc58 = 0.0;
  }
  for (local_158 = 0; local_158 < local_15c; local_158 = local_158 + 1) {
    ppVar6 = TPZVec<std::pair<int,_int>_>::operator[]
                       ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5b0),(long)local_158);
    pfVar5 = TPZFMatrix<float>::operator()
                       (in_stack_fffffffffffffc60,(int64_t)in_stack_fffffffffffffc58,(int64_t)ppVar6
                       );
    fVar1 = *pfVar5;
    pfVar5 = TPZFMatrix<float>::operator()
                       (in_stack_fffffffffffffc60,(int64_t)in_stack_fffffffffffffc58,(int64_t)ppVar6
                       );
    *pfVar5 = fVar1;
  }
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1fe7e05);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1fe7e12);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1fe7e1f);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1fe7e2c);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::AdjustResidual(TPZFMatrix<TVar> &r_global)
{
	int nglob = fNEquations;
	int nint = this->fInternalEqs.NElements();
	TPZFMatrix<TVar> rint(nint,1,0.),radapt(nglob,1,0.);
	int i;
	for(i=0; i<nint; i++)
	{
		if(fGlobalIndex[fInternalEqs[i]] >= 0)
		{
			rint(i,0) = r_global(fGlobalIndex[fInternalEqs[i]]);
		}
	}
	
	// initializar radapt com zero
	int neqs = fGlobalEqs.NElements();
	for(i=0; i<neqs; i++)
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		radapt(ind.first,0) = r_global(ind.second,0);
	}
	fInvertedInternalStiffness.Solve(rint,fAdjustSolution);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Adjusted internal solution";
		fAdjustSolution.Print("fAdjustSolution",sout);
		rint.Print("Internal residual",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	TPZFMatrix<TVar> rloc(nglob,1,0.),radjust(nglob,1,0.);
	for(i=0; i<nint; i++)
	{
		rloc(fInternalEqs[i],0) = fAdjustSolution(i,0);
	}
	fStiffness->MultAdd(rloc,radapt,radjust,-1.,1.);
	for(i=0; i<nint; i++)
	{
		if(fabs(radjust(fInternalEqs[i],0)) >= 1.e-10)
		{
			std::cout << "Internal node " << i << " was not zeroed " << radjust(fInternalEqs[i],0) << std::endl;
		}
		radjust(fInternalEqs[i],0) = 0.;
	}
	
	// somar a contribuicao no r_global (tarefa)
	for(i=0; i<neqs; i++)
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		r_global(ind.second,0) = radjust(ind.first,0);
	}
}